

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle_default.cpp
# Opt level: O0

StyleSheet * __thiscall QStyleSheetStyle::getDefaultStyleSheet(QStyleSheetStyle *this)

{
  bool bVar1;
  DeclarationData *pDVar2;
  StyleSheet *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  bool styleIsPixmapBased;
  StyleSheet *sheet;
  Declaration decl;
  Selector selector;
  AttributeSelector attr;
  Pseudo pseudo;
  BasicSelector bSelector;
  StyleRule styleRule;
  Value value;
  parameter_type in_stack_fffffffffffff638;
  undefined7 in_stack_fffffffffffff640;
  byte in_stack_fffffffffffff647;
  StyleSheet *this_00;
  byte local_999;
  QLatin1String *local_998;
  QLatin1String *local_988;
  QLatin1String *local_978;
  QLatin1String *local_968;
  QLatin1String *local_958;
  QLatin1String *local_948;
  QLatin1String *local_938;
  QLatin1String *local_928;
  QLatin1String *local_918;
  QLatin1String *local_908;
  QLatin1String *local_8f8;
  QLatin1String *local_8e8;
  QLatin1String *local_8d8;
  QLatin1String *local_8c8;
  QLatin1String *local_8b8;
  QLatin1String *local_8a8;
  QLatin1String *local_898;
  QLatin1String *local_888;
  QLatin1String *local_878;
  QLatin1String *local_868;
  QLatin1String *local_858;
  QLatin1String *local_848;
  QLatin1String *local_838;
  QLatin1String *local_828;
  QLatin1String *local_818;
  QLatin1String *local_808;
  QLatin1String *local_7f8;
  QLatin1String *local_7e8;
  QLatin1String *local_7d8;
  QLatin1String *local_7c8;
  QLatin1String *local_7b8;
  QLatin1String *local_7a8;
  QLatin1String *local_798;
  QLatin1String *local_788;
  QLatin1String *local_778;
  QLatin1String *local_768;
  QLatin1String *local_758;
  QLatin1String *local_748;
  QLatin1String *local_738;
  QLatin1String *local_728;
  QLatin1String *local_718;
  QLatin1String *local_708;
  QLatin1String *local_6f8;
  QLatin1String *local_6e8;
  QLatin1String *local_6d8;
  QLatin1String *local_6c8;
  QLatin1String *local_6b8;
  QLatin1String *local_6a8;
  QLatin1String *local_698;
  QLatin1String *local_688;
  QLatin1String *local_678;
  QLatin1String *local_668;
  QLatin1String *local_658;
  QLatin1String *local_648;
  storage_type *local_620;
  undefined1 local_610 [24];
  storage_type *local_5f8;
  undefined1 local_5e8 [24];
  storage_type *local_5d0;
  undefined1 local_5c0 [24];
  storage_type *local_5a8;
  undefined1 local_598 [24];
  storage_type *local_580;
  undefined1 local_570 [24];
  storage_type *local_558;
  undefined1 local_548 [24];
  storage_type *local_530;
  undefined1 local_520 [24];
  undefined1 *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  QString local_4e8;
  QString QStack_4d0;
  undefined4 local_4b8;
  undefined8 local_4b0;
  QString aQStack_4a8 [2];
  QString local_470 [4];
  undefined1 local_408 [56];
  QVariant local_3d0;
  QVariant local_3b0;
  QVariant local_390;
  QVariant local_370;
  QVariant local_350;
  QVariant local_330;
  QVariant local_310;
  QVariant local_2f0;
  QVariant local_2d0;
  QVariant local_2b0;
  QVariant local_290;
  QVariant local_270;
  QVariant local_250;
  QVariant local_230;
  QVariant local_210;
  QVariant local_1f0;
  QVariant local_1d0;
  QVariant local_1b0;
  QVariant local_190;
  QVariant local_170;
  QVariant local_150;
  QVariant local_130;
  QVariant local_110;
  QVariant local_f0;
  QVariant local_d0;
  QVariant local_b0;
  QVariant local_90;
  QVariant local_70;
  QVariant local_50;
  undefined4 local_30 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0xa0);
  QCss::StyleSheet::StyleSheet
            ((StyleSheet *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  memset(local_408,0xaa,0x38);
  QCss::StyleRule::StyleRule
            ((StyleRule *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  memset(local_470,0xaa,0x68);
  QCss::BasicSelector::BasicSelector
            ((BasicSelector *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_500 = &DAT_aaaaaaaaaaaaaaaa;
  local_4f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_4f0 = &DAT_aaaaaaaaaaaaaaaa;
  QCss::Selector::Selector((Selector *)0x47fb29);
  local_508 = &DAT_aaaaaaaaaaaaaaaa;
  QCss::Declaration::Declaration
            ((Declaration *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  memset(local_30,0xaa,0x28);
  QCss::Value::Value((Value *)0x47fb69);
  memset(&local_4b0,0xaa,0x40);
  QCss::Pseudo::Pseudo((Pseudo *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  memset(&local_4e8,0xaa,0x38);
  QCss::AttributeSelector::AttributeSelector
            ((AttributeSelector *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  baseStyle((QStyleSheetStyle *)in_RDI);
  bVar1 = QObject::inherits((QObject *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
                            ,(char *)in_stack_fffffffffffff638);
  local_999 = 1;
  if (!bVar1) {
    baseStyle((QStyleSheetStyle *)in_RDI);
    bVar1 = QObject::inherits((QObject *)
                              CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                              (char *)in_stack_fffffffffffff638);
    in_stack_fffffffffffff647 = 0;
    local_999 = in_stack_fffffffffffff647;
    if (bVar1) {
      baseStyle((QStyleSheetStyle *)in_RDI);
      bVar1 = QObject::inherits((QObject *)
                                CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                                (char *)in_stack_fffffffffffff638);
      in_stack_fffffffffffff647 = bVar1 ^ 0xff;
      local_999 = in_stack_fffffffffffff647;
    }
  }
  local_999 = local_999 & 1;
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_648 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_648);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fd09);
  local_658 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_658);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fd32);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_50,0x44);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_50);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fd89);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fdd0);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fe0a);
  local_668 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_668);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fe33);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_70,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_70);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fe8a);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47fed1);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47ff0b);
  local_678 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_678);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47ff34);
  pDVar2->propertyId = QtStyleFeatures;
  local_30[0] = 5;
  QByteArrayView::QByteArrayView<17ul>((QByteArrayView *)this_00,(char (*) [17])in_RDI);
  QVar4.m_data = local_530;
  QVar4.m_size = (qsizetype)local_520;
  QString::fromLatin1(QVar4);
  ::QVariant::QVariant(&local_90,(QString *)local_520);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_90);
  QString::~QString((QString *)0x47ffbf);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x47ffcc);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480013);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_688 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_688);
  local_4b0 = 0x20000000;
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_698 = (QLatin1String *)QVar3.m_size;
  QString::operator=(aQStack_4a8,local_698);
  QList<QCss::Pseudo>::operator<<
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48018c);
  local_6a8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_6a8);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4801b5);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_b0,0x27);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_b0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48020c);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480253);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_6b8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_6b8);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480365);
  local_6c8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_6c8);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48038e);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_d0,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_d0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4803e5);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48042c);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_6d8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_6d8);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_6e8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_6e8);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4805e6);
  local_6f8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_6f8);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48060f);
  pDVar2->propertyId = Background;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_f0,0x27);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_f0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480666);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4806ad);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4806e7);
  local_708 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_708);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480710);
  pDVar2->propertyId = BorderImage;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_110,0x27);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_110);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480767);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4807ae);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_718 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_718);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4808c0);
  local_728 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_728);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4808e9);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_130,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_130);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480940);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480987);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_738 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_738);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480a99);
  local_748 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_748);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480ac2);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_150,0x45);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_150);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480b19);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480b60);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480b9a);
  local_758 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_758);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480bc3);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_170,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_170);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480c1a);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480c61);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_768 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_768);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_778 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_778);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480e1b);
  local_788 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_788);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480e44);
  pDVar2->propertyId = BorderStyles;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_190,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_190);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480e9b);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480ee2);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  if (local_999 == 0) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480f2a
                       );
    local_798 = (QLatin1String *)QVar3.m_size;
    QString::operator=(&pDVar2->property,local_798);
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480f53
                       );
    pDVar2->propertyId = QtStyleFeatures;
    local_30[0] = 5;
    QByteArrayView::QByteArrayView<17ul>((QByteArrayView *)this_00,(char (*) [17])in_RDI);
    QVar5.m_data = local_558;
    QVar5.m_size = (qsizetype)local_548;
    QString::fromLatin1(QVar5);
    ::QVariant::QVariant(&local_1b0,(QString *)local_548);
    ::QVariant::operator=
              ((QVariant *)in_RDI,
               (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    ::QVariant::~QVariant(&local_1b0);
    QString::~QString((QString *)0x480fde);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x480feb);
    QList<QCss::Value>::operator<<
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::Declaration>::operator<<
              ((QList<QCss::Declaration> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481032);
    QList<QCss::Value>::clear
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  }
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_7a8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_7a8);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481144);
  local_7b8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_7b8);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48116d);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_1d0,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_1d0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4811c4);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48120b);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  if (local_999 == 0) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481253
                       );
    local_7c8 = (QLatin1String *)QVar3.m_size;
    QString::operator=(&pDVar2->property,local_7c8);
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48127c
                       );
    pDVar2->propertyId = QtStyleFeatures;
    local_30[0] = 5;
    QByteArrayView::QByteArrayView<17ul>((QByteArrayView *)this_00,(char (*) [17])in_RDI);
    QVar6.m_data = local_580;
    QVar6.m_size = (qsizetype)local_570;
    QString::fromLatin1(QVar6);
    ::QVariant::QVariant(&local_1f0,(QString *)local_570);
    ::QVariant::operator=
              ((QVariant *)in_RDI,
               (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    ::QVariant::~QVariant(&local_1f0);
    QString::~QString((QString *)0x481307);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481314);
    QList<QCss::Value>::operator<<
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    local_30[0] = 5;
    QByteArrayView::QByteArrayView<20ul>((QByteArrayView *)this_00,(char (*) [20])in_RDI);
    QVar7.m_data = local_5a8;
    QVar7.m_size = (qsizetype)local_598;
    QString::fromLatin1(QVar7);
    ::QVariant::QVariant(&local_210,(QString *)local_598);
    ::QVariant::operator=
              ((QVariant *)in_RDI,
               (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    ::QVariant::~QVariant(&local_210);
    QString::~QString((QString *)0x4813ac);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4813b9);
    QList<QCss::Value>::operator<<
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::Declaration>::operator<<
              ((QList<QCss::Declaration> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481400);
    QList<QCss::Value>::clear
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  }
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48143a);
  local_7d8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_7d8);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481463);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_230,0x44);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_230);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4814ba);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481501);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  baseStyle((QStyleSheetStyle *)in_RDI);
  bVar1 = QObject::inherits((QObject *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
                            ,(char *)in_stack_fffffffffffff638);
  if (!bVar1) {
    baseStyle((QStyleSheetStyle *)in_RDI);
    bVar1 = QObject::inherits((QObject *)
                              CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                              (char *)in_stack_fffffffffffff638);
    if (!bVar1) {
      baseStyle((QStyleSheetStyle *)in_RDI);
      bVar1 = QObject::inherits((QObject *)
                                CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                                (char *)in_stack_fffffffffffff638);
      if (!bVar1) goto LAB_00481816;
    }
  }
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_7e8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_7e8);
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_7f8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&local_4e8,local_7f8);
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_808 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&QStack_4d0,local_808);
  local_4b8 = 1;
  QList<QCss::AttributeSelector>::operator<<
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481713);
  local_818 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_818);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48173c);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_250,0x3c);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_250);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481793);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4817da);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
LAB_00481816:
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_828 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_828);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4818ec);
  local_838 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_838);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481915);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_270,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_270);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48196c);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4819b3);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4819ed);
  local_848 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_848);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481a16);
  pDVar2->propertyId = QtStyleFeatures;
  local_30[0] = 5;
  QByteArrayView::QByteArrayView<17ul>((QByteArrayView *)this_00,(char (*) [17])in_RDI);
  QVar8.m_data = local_5d0;
  QVar8.m_size = (qsizetype)local_5c0;
  QString::fromLatin1(QVar8);
  ::QVariant::QVariant(&local_290,(QString *)local_5c0);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_290);
  QString::~QString((QString *)0x481aa1);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481aae);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481af5);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481b2f);
  local_858 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_858);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481b58);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_2b0,0x44);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_2b0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481baf);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481bf6);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_868 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_868);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481d08);
  local_878 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_878);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481d31);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_2d0,0x45);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_2d0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481d88);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481dcf);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  if (local_999 == 0) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    local_888 = (QLatin1String *)QVar3.m_size;
    QString::operator=(local_470,local_888);
    local_4b0 = 0;
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    local_898 = (QLatin1String *)QVar3.m_size;
    QString::operator=(aQStack_4a8,local_898);
    QList<QCss::Pseudo>::operator<<
              ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::BasicSelector>::operator<<
              ((QList<QCss::BasicSelector> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               in_stack_fffffffffffff638);
    QList<QString>::clear
              ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QList<QCss::Pseudo>::clear
              ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    QList<QCss::AttributeSelector>::clear
              ((QList<QCss::AttributeSelector> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QList<QCss::Selector>::operator<<
              ((QList<QCss::Selector> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::BasicSelector>::clear
              ((QList<QCss::BasicSelector> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481f56
                       );
    local_8a8 = (QLatin1String *)QVar3.m_size;
    QString::operator=(&pDVar2->property,local_8a8);
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x481f7f
                       );
    pDVar2->propertyId = QtStyleFeatures;
    local_30[0] = 5;
    QByteArrayView::QByteArrayView<17ul>((QByteArrayView *)this_00,(char (*) [17])in_RDI);
    QVar9.m_data = local_5f8;
    QVar9.m_size = (qsizetype)local_5e8;
    QString::fromLatin1(QVar9);
    ::QVariant::QVariant(&local_2f0,(QString *)local_5e8);
    ::QVariant::operator=
              ((QVariant *)in_RDI,
               (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    ::QVariant::~QVariant(&local_2f0);
    QString::~QString((QString *)0x48200a);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482017);
    QList<QCss::Value>::operator<<
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::Declaration>::operator<<
              ((QList<QCss::Declaration> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48205e);
    QList<QCss::Value>::clear
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QList<QCss::StyleRule>::operator<<
              ((QList<QCss::StyleRule> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::Selector>::clear
              ((QList<QCss::Selector> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QList<QCss::Declaration>::clear
              ((QList<QCss::Declaration> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  }
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_8b8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_8b8);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482170);
  local_8c8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_8c8);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482199);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_310,0x45);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_310);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4821f0);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482237);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_8d8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_8d8);
  local_4b0 = 0;
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_8e8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(aQStack_4a8,local_8e8);
  QList<QCss::Pseudo>::operator<<
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_8f8 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_8f8);
  local_4b0 = 0;
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_908 = (QLatin1String *)QVar3.m_size;
  QString::operator=(aQStack_4a8,local_908);
  QList<QCss::Pseudo>::operator<<
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4824bf);
  local_918 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_918);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4824e8);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_330,0x3c);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_330);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48253f);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482586);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  if (local_999 == 0) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
    ;
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4825ce
                       );
    local_928 = (QLatin1String *)QVar3.m_size;
    QString::operator=(&pDVar2->property,local_928);
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4825f7
                       );
    pDVar2->propertyId = QtStyleFeatures;
    local_30[0] = 5;
    QByteArrayView::QByteArrayView<17ul>((QByteArrayView *)this_00,(char (*) [17])in_RDI);
    QVar10.m_data = local_620;
    QVar10.m_size = (qsizetype)local_610;
    QString::fromLatin1(QVar10);
    ::QVariant::QVariant(&local_350,(QString *)local_610);
    ::QVariant::operator=
              ((QVariant *)in_RDI,
               (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    ::QVariant::~QVariant(&local_350);
    QString::~QString((QString *)0x482682);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48268f);
    QList<QCss::Value>::operator<<
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QList<QCss::Declaration>::operator<<
              ((QList<QCss::Declaration> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               (parameter_type)in_stack_fffffffffffff638);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
               CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4826d6);
    QList<QCss::Value>::clear
              ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  }
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482710);
  local_938 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_938);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482739);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_370,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_370);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482790);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4827d7);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_948 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_948);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4828e3);
  local_958 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_958);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482906);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_390,0x44);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_390);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x48295d);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x4829a4);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_968 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_968);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482aa4);
  local_978 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_978);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482ac7);
  pDVar2->propertyId = QtBackgroundRole;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_3b0,0x45);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_3b0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482b1e);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482b65);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  local_988 = (QLatin1String *)QVar3.m_size;
  QString::operator=(local_470,local_988);
  QList<QCss::BasicSelector>::operator<<
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),in_stack_fffffffffffff638
            );
  QList<QString>::clear
            ((QList<QString> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Pseudo>::clear
            ((QList<QCss::Pseudo> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::AttributeSelector>::clear
            ((QList<QCss::AttributeSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::Selector>::operator<<
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::BasicSelector>::clear
            ((QList<QCss::BasicSelector> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RDI,CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482c65);
  local_998 = (QLatin1String *)QVar3.m_size;
  QString::operator=(&pDVar2->property,local_998);
  pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482c88);
  pDVar2->propertyId = Border;
  local_30[0] = 6;
  ::QVariant::QVariant(&local_3d0,0x18);
  ::QVariant::operator=
            ((QVariant *)in_RDI,
             (QVariant *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  ::QVariant::~QVariant(&local_3d0);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482cdf);
  QList<QCss::Value>::operator<<
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Declaration>::operator<<
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
             (parameter_type)in_stack_fffffffffffff638);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x482d26);
  QList<QCss::Value>::clear
            ((QList<QCss::Value> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QList<QCss::StyleRule>::operator<<
            ((QList<QCss::StyleRule> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640)
             ,(parameter_type)in_stack_fffffffffffff638);
  QList<QCss::Selector>::clear
            ((QList<QCss::Selector> *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640))
  ;
  QList<QCss::Declaration>::clear
            ((QList<QCss::Declaration> *)
             CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  this_00->origin = StyleSheetOrigin_UserAgent;
  QCss::StyleSheet::buildIndexes((CaseSensitivity)this_00);
  QCss::AttributeSelector::~AttributeSelector
            ((AttributeSelector *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QCss::Pseudo::~Pseudo((Pseudo *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QCss::Value::~Value((Value *)0x482da7);
  QCss::Declaration::~Declaration((Declaration *)0x482db4);
  QCss::Selector::~Selector((Selector *)0x482dc1);
  QCss::BasicSelector::~BasicSelector
            ((BasicSelector *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  QCss::StyleRule::~StyleRule
            ((StyleRule *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

StyleSheet QStyleSheetStyle::getDefaultStyleSheet() const
{
    StyleSheet sheet;
    StyleRule styleRule;
    BasicSelector bSelector;
    Selector selector;
    Declaration decl;
    QCss::Value value;
    Pseudo pseudo;
    AttributeSelector attr;

    // pixmap based style doesn't support any features
    bool styleIsPixmapBased = baseStyle()->inherits("QMacStyle")
            || (baseStyle()->inherits("QWindowsVistaStyle")
                && !baseStyle()->inherits("QWindows11Style"));


    /*QLineEdit {
        -qt-background-role: base;
        border: native;
        -qt-style-features: background-color;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLineEdit:no-frame {
        border: none;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_PSEUDO("no-frame"_L1, PseudoClass_Frameless);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QFrame {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QFrame"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLabel, QToolBox {
        background: none;
        border-image: none;
    }*/
    {
        SET_ELEMENT_NAME("QLabel"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("background"_L1, Background);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        SET_PROPERTY("border-image"_L1, BorderImage);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QGroupBox {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QGroupBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }


    /*QToolTip {
        -qt-background-role: window;
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QToolTip"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QPushButton, QToolButton {
        border-style: native;
        -qt-style-features: background-color;  //only for not pixmap based styles
    }*/
    {
        SET_ELEMENT_NAME("QPushButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border-style"_L1, BorderStyles);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }


        ADD_STYLE_RULE;
    }


    /*QComboBox {
        border: native;
        -qt-style-features: background-color background-gradient;   //only for not pixmap based styles
        -qt-background-role: base;
    }*/

    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-gradient"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QComboBox[style="QPlastiqueStyle"][readOnly="true"],
    QComboBox[style="QFusionStyle"][readOnly="true"],
    QComboBox[style="QCleanlooksStyle"][readOnly="true"]
    {
        -qt-background-role: button;
    }*/
    if (baseStyle()->inherits("QPlastiqueStyle")  || baseStyle()->inherits("QCleanlooksStyle") || baseStyle()->inherits("QFusionStyle"))
    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_ATTRIBUTE_SELECTOR("readOnly"_L1, "true"_L1, AttributeSelector::MatchEqual);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QAbstractSpinBox {
        border: native;
        -qt-style-features: background-color;
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QAbstractSpinBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QMenu {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }
    /*QMenu::item {
        -qt-style-features: background-color;
    }*/
    if (!styleIsPixmapBased) {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_PSEUDO("item"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QHeaderView {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QTableCornerButton::section, QHeaderView::section {
        -qt-background-role: button;
        -qt-style-features: background-color; //if style is not pixmap based
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QTableCornerButton"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QProgressBar {
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QProgressBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QScrollBar {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QScrollBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QDockWidget {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QDockWidget"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    sheet.origin = StyleSheetOrigin_UserAgent;
    sheet.buildIndexes();
    return sheet;
}